

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

string * __thiscall
gl3cts::PerVertexValidationTest::getTestIterationName_abi_cxx11_
          (string *__return_storage_ptr__,PerVertexValidationTest *this,_test_iteration iteration)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?!","");
  if (iteration < TEST_ITERATION_COUNT) {
    pcVar1 = &DAT_01ab1088 + *(int *)(&DAT_01ab1088 + (ulong)iteration * 4);
  }
  else {
    pcVar1 = "Unknown";
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PerVertexValidationTest::getTestIterationName(_test_iteration iteration) const
{
	std::string result = "?!";

	switch (iteration)
	{
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE:
		result = "Input gl_ClipDistance usage in Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE:
		result = "Input gl_CullDistance usage in Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE:
		result = "Input gl_PointSize usage in a separable Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE:
		result = "Input gl_Position usage in a separable Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE:
		result = "Input gl_ClipDistance usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CULLDISTANCE_USAGE:
		result = "Input gl_CullDistance usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POINTSIZE_USAGE:
		result = "Input gl_PointSize usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POSITION_USAGE:
		result = "Input gl_Position usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE:
		result = "Input gl_ClipDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CULLDISTANCE_USAGE:
		result = "Input gl_CullDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POINTSIZE_USAGE:
		result = "Input gl_PointSize usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POSITION_USAGE:
		result = "Input gl_Position usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE:
		result = "Output gl_ClipDistance usage in Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CULLDISTANCE_USAGE:
		result = "Output gl_CullDistance usage in Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POINTSIZE_USAGE:
		result = "Output gl_PointSize usage in a separable Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POSITION_USAGE:
		result = "Output gl_Position usage in a separable Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE:
		result = "Output gl_ClipDistance usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CULLDISTANCE_USAGE:
		result = "Output gl_CullDistance usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POINTSIZE_USAGE:
		result = "Output gl_PointSize usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POSITION_USAGE:
		result = "Output gl_Position usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE:
		result = "Output gl_ClipDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex "
				 "block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CULLDISTANCE_USAGE:
		result = "Output gl_CullDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex "
				 "block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POINTSIZE_USAGE:
		result = "Output gl_PointSize usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POSITION_USAGE:
		result = "Output gl_Position usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE:
		result = "Output gl_ClipDistance usage in a separable Vertex Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CULLDISTANCE_USAGE:
		result = "Output gl_CullDistance usage in a separable Vertex Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE:
		result = "Output gl_PointSize usage in a separable Vertex Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE:
		result = "Output gl_Position usage in a separable Vertex Shader without gl_PerVertex block redeclaration";
		break;

	case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_GS_VS:
		result = "Geometry and Vertex Shaders use different gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_GS_TC_TE_VS:
		result = "Geometry, Tessellation Control, Tessellation Evaluation and Vertex Shaders use a different "
				 "gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_TC_TE_VS:
		result = "Tesselation Control, Tessellation Evaluation and Vertex Shaders use a different gl_PerVertex block "
				 "redeclaration";
		break;

	case TEST_ITERATION_PERVERTEX_BLOCK_UNDEFINED:
		result =
			"No gl_PerVertex block defined in shader programs for all shader stages supported by the running context";
		break;
	default:
		result = "Unknown";
		break;
	}

	return result;
}